

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O2

void __thiscall tlog::Progress::Progress(Progress *this,Logger *logger,uint64_t total)

{
  rep rVar1;
  
  this->mLogger = logger;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->mStartTime).__d.__r = rVar1;
  this->mTotal = total;
  update(this,0);
  return;
}

Assistant:

Progress(Logger* logger, uint64_t total)
        : mLogger{logger}, mStartTime{std::chrono::steady_clock::now()}, mTotal{total} {
            update(0); // Initial print with 0 progress.
        }